

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_trace_file_base.cpp
# Opt level: O3

string * __thiscall
sc_core::sc_trace_file_base::fs_unit_to_str_abi_cxx11_
          (string *__return_storage_ptr__,sc_trace_file_base *this,unit_type tu)

{
  ostream *poVar1;
  char *pcVar2;
  char *pcVar3;
  stringstream ss;
  char *local_1c0;
  char local_1b0 [16];
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  if ((long)this < 1000000000) {
    if ((long)this < 10000) {
      if ((long)this < 100) {
        if (this == (sc_trace_file_base *)0x1) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar3 = "1 fs";
          pcVar2 = "";
        }
        else {
          if (this != (sc_trace_file_base *)0xa) {
LAB_00207207:
            std::__cxx11::stringstream::stringstream(local_1a0);
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_190,"not a power of ten: ",0x14);
            poVar1 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)local_190);
            std::__ostream_insert<char,std::char_traits<char>>(poVar1," fs",3);
            std::__cxx11::stringbuf::str();
            sc_report_handler::report
                      (SC_ERROR,"invalid tracing timescale unit set",local_1c0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/tracing/sc_trace_file_base.cpp"
                       ,0x14d);
            if (local_1c0 != local_1b0) {
              operator_delete(local_1c0);
            }
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
            std::__cxx11::stringstream::~stringstream(local_1a0);
            return __return_storage_ptr__;
          }
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar3 = "10 fs";
          pcVar2 = "";
        }
      }
      else if (this == (sc_trace_file_base *)0x64) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar3 = "100 fs";
        pcVar2 = "";
      }
      else {
        if (this != (sc_trace_file_base *)0x3e8) goto LAB_00207207;
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar3 = "1 ps";
        pcVar2 = "";
      }
    }
    else if ((long)this < 1000000) {
      if (this == (sc_trace_file_base *)0x2710) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar3 = "10 ps";
        pcVar2 = "";
      }
      else {
        if (this != (sc_trace_file_base *)0x186a0) goto LAB_00207207;
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar3 = "100 ps";
        pcVar2 = "";
      }
    }
    else if (this == (sc_trace_file_base *)0xf4240) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "1 ns";
      pcVar2 = "";
    }
    else if (this == (sc_trace_file_base *)0x989680) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "10 ns";
      pcVar2 = "";
    }
    else {
      if (this != (sc_trace_file_base *)0x5f5e100) goto LAB_00207207;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "100 ns";
      pcVar2 = "";
    }
  }
  else if ((long)this < 10000000000000) {
    if ((long)this < 100000000000) {
      if (this == (sc_trace_file_base *)0x3b9aca00) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar3 = "1 us";
        pcVar2 = "";
      }
      else {
        if (this != (sc_trace_file_base *)0x2540be400) goto LAB_00207207;
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar3 = "10 us";
        pcVar2 = "";
      }
    }
    else if (this == (sc_trace_file_base *)0x174876e800) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "100 us";
      pcVar2 = "";
    }
    else {
      if (this != (sc_trace_file_base *)0xe8d4a51000) goto LAB_00207207;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "1 ms";
      pcVar2 = "";
    }
  }
  else if ((long)this < 1000000000000000) {
    if (this == (sc_trace_file_base *)0x9184e72a000) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "10 ms";
      pcVar2 = "";
    }
    else {
      if (this != (sc_trace_file_base *)0x5af3107a4000) goto LAB_00207207;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "100 ms";
      pcVar2 = "";
    }
  }
  else if (this == (sc_trace_file_base *)0x38d7ea4c68000) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "1 sec";
    pcVar2 = "";
  }
  else if (this == (sc_trace_file_base *)0x2386f26fc10000) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "10 sec";
    pcVar2 = "";
  }
  else {
    if (this != (sc_trace_file_base *)0x16345785d8a0000) goto LAB_00207207;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "100 sec";
    pcVar2 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string
sc_trace_file_base::fs_unit_to_str(sc_trace_file_base::unit_type tu)
{
    switch (tu)
    {
        case UINT64_C(1): return "1 fs";
        case UINT64_C(10): return "10 fs";
        case UINT64_C(100): return "100 fs";
        case UINT64_C(1000): return "1 ps";
        case UINT64_C(10000): return "10 ps";
        case UINT64_C(100000): return "100 ps";
        case UINT64_C(1000000): return "1 ns";
        case UINT64_C(10000000): return "10 ns";
        case UINT64_C(100000000): return "100 ns";
        case UINT64_C(1000000000): return "1 us";
        case UINT64_C(10000000000): return "10 us";
        case UINT64_C(100000000000): return "100 us";
        case UINT64_C(1000000000000): return "1 ms";
        case UINT64_C(10000000000000): return "10 ms";
        case UINT64_C(100000000000000): return "100 ms";
        case UINT64_C(1000000000000000): return "1 sec";
        case UINT64_C(10000000000000000): return "10 sec";
        case UINT64_C(100000000000000000): return "100 sec";
        default: /* fail below */ (void)0;
    }

    std::stringstream ss;
    ss << "not a power of ten: " << tu << " fs";
    SC_REPORT_ERROR( SC_ID_TRACING_INVALID_TIMESCALE_UNIT_,
                     ss.str().c_str() );
    return "";
}